

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O0

Error asmjit::v1_14::arm::FormatterInternal::formatCondCode(String *sb,CondCode cc)

{
  Error EVar1;
  byte in_SIL;
  undefined8 in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffcc;
  
  EVar1 = String::_opString((String *)0xffffffffffffffff,(ModifyOp)((ulong)in_RDI >> 0x20),
                            (char *)CONCAT44(CONCAT13(in_SIL,in_stack_ffffffffffffffcc),(uint)in_SIL
                                            ),CONCAT44(0x10,in_stack_ffffffffffffffc0));
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatCondCode(String& sb, CondCode cc) noexcept {
  static const char condCodeData[] =
    "al\0" "na\0"
    "eq\0" "ne\0"
    "hs\0" "lo\0" "mi\0" "pl\0" "vs\0" "vc\0"
    "hi\0" "ls\0" "ge\0" "lt\0" "gt\0" "le\0"
    "<Unknown>";
  return sb.append(condCodeData + Support::min<uint32_t>(uint32_t(cc), 16u) * 3);
}